

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Stress::anon_unknown_0::RenderCase::drawTestPattern(RenderCase *this,bool useTexture)

{
  code *pcVar1;
  code *pcVar2;
  byte bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  RenderTarget *this_00;
  PixelFormat *this_01;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  char *pcVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  ProgramSources *pPVar13;
  reference pvVar14;
  uchar *puVar15;
  char *__s;
  float fVar16;
  float fVar17;
  MessageBuilder local_a80;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  LogImage local_8b0;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  LogImage local_7d0;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  LogImageSet local_6f0;
  MessageBuilder local_6b0;
  deUint32 local_530;
  deUint32 local_52c;
  Vector<int,_4> local_528;
  Vector<int,_4> local_518;
  Vector<int,_4> local_508;
  undefined1 local_4f8 [8];
  IVec4 colorDiff;
  RGBA col;
  int colorThreshold;
  RGBA *refCol;
  RGBA local_4d0;
  RGBA refColGradient;
  RGBA refColTexture;
  deUint8 texRedComponent;
  float texGradientPosY;
  float texGradientPosX;
  int x_1;
  int y_1;
  Vector<unsigned_char,_4> local_489;
  uchar local_485;
  int local_484;
  int iStack_480;
  deUint8 redComponent;
  int y;
  int x;
  vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_> buffer;
  int textureSize;
  GLuint textureID;
  GLint positionLoc;
  ShaderSource local_430;
  allocator<char> local_401;
  string local_400;
  ShaderSource local_3e0;
  ProgramSources local_3b8;
  undefined1 local_2e8 [8];
  ShaderProgram patternProgram;
  Functions *gl;
  MessageBuilder local_208;
  byte local_81;
  undefined1 local_80 [7];
  bool error;
  Surface errorMask;
  Surface resultImage;
  RGBA formatThreshold;
  char *fragmentSource;
  char *fragmentSourceTex;
  char *fragmentSourceNoTex;
  char *vertexSource;
  bool useTexture_local;
  RenderCase *this_local;
  
  if ((Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::fullscreenQuad == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)
                                   ::fullscreenQuad), iVar4 != 0)) {
    tcu::Vector<float,_4>::Vector(drawTestPattern::fullscreenQuad,-1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(drawTestPattern::fullscreenQuad + 1,-1.0,1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(drawTestPattern::fullscreenQuad + 2,1.0,-1.0,0.0,1.0);
    tcu::Vector<float,_4>::Vector(drawTestPattern::fullscreenQuad + 3,1.0,1.0,0.0,1.0);
    __cxa_guard_release(&Stress::(anonymous_namespace)::RenderCase::drawTestPattern(bool)::
                         fullscreenQuad);
  }
  __s = 
  "varying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n}\n"
  ;
  if (useTexture) {
    __s = 
    "uniform mediump sampler2D u_sampler;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tgl_FragColor = texture2D(u_sampler, v_position.xy);\n}\n"
    ;
  }
  this_00 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  resultImage.m_pixels.m_cap._4_4_ = tcu::PixelFormat::getColorThreshold(this_01);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,0x100,0x100);
  tcu::Surface::Surface((Surface *)local_80,0x100,0x100);
  local_81 = 0;
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_208,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_208,(char (*) [34])"Drawing a test pattern to detect ");
  pcVar11 = "";
  if (useTexture) {
    pcVar11 = "texture sampling";
  }
  gl = (Functions *)pcVar11;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char **)&gl);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [15])" side-effects.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_208);
  pRVar12 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar12->_vptr_RenderContext[3])();
  patternProgram.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar12 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,
             "attribute highp vec4 a_pos;\nvarying mediump vec4 v_position;\nvoid main ()\n{\n\tv_position = a_pos;\n\tgl_Position = a_pos;\n}\n"
             ,&local_401);
  glu::VertexSource::VertexSource((VertexSource *)&local_3e0,&local_400);
  pPVar13 = glu::ProgramSources::operator<<(&local_3b8,&local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,__s,(allocator<char> *)((long)&textureID + 3));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_430,(string *)&positionLoc);
  pPVar13 = glu::ProgramSources::operator<<(pPVar13,&local_430);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2e8,pRVar12,pPVar13);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_430);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&textureID + 3));
  glu::VertexSource::~VertexSource((VertexSource *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  glu::ProgramSources::~ProgramSources(&local_3b8);
  pcVar1 = *(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
  uVar6 = (*pcVar1)(dVar5,"a_pos");
  buffer.
  super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  if (useTexture) {
    buffer.
    super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
    std::allocator<tcu::Vector<unsigned_char,_4>_>::allocator
              ((allocator<tcu::Vector<unsigned_char,_4>_> *)((long)&y + 3));
    std::vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_> *
           )&x,0x400,(allocator<tcu::Vector<unsigned_char,_4>_> *)((long)&y + 3));
    std::allocator<tcu::Vector<unsigned_char,_4>_>::~allocator
              ((allocator<tcu::Vector<unsigned_char,_4>_> *)((long)&y + 3));
    for (iStack_480 = 0; iStack_480 < 0x20; iStack_480 = iStack_480 + 1) {
      for (local_484 = 0; local_484 < 0x20; local_484 = local_484 + 1) {
        fVar16 = de::abs<float>((float)iStack_480 * 0.03125 + -0.5);
        fVar17 = de::abs<float>((float)local_484 * 0.03125 + -0.5);
        fVar16 = de::clamp<float>(fVar16 * 255.0 + fVar17 * 255.0,0.0,255.0);
        local_485 = (uchar)(int)fVar16;
        tcu::Vector<unsigned_char,_4>::Vector(&local_489,local_485,0xff,0xff,0xff);
        pvVar14 = std::
                  vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                  ::operator[]((vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                                *)&x,(long)(iStack_480 * 0x20 + local_484));
        *&pvVar14->m_data = local_489.m_data;
      }
    }
    (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x6f8))
              (1,(undefined1 *)
                 ((long)&buffer.
                         super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0xb8))
              (0xde1,buffer.
                     super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    pcVar1 = *(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1310);
    pvVar14 = std::
              vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
              ::operator[]((vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                            *)&x,0);
    puVar15 = tcu::Vector<unsigned_char,_4>::getPtr(pvVar14);
    (*pcVar1)(0xde1,0,0x1908,0x20,0x20,0,0x1908,0x1401,puVar15);
    (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1360))(0xde1,0x2801,0x2601);
    std::vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>::
    ~vector((vector<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
             *)&x);
  }
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x188))(0x4000);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1a00))(0,0,0x100);
  pcVar1 = *(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
  (*pcVar1)(dVar5);
  if (useTexture) {
    pcVar1 = *(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x14f0);
    pcVar2 = *(code **)(patternProgram.m_program.m_info.linkTimeUs + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2e8);
    uVar7 = (*pcVar2)(dVar5,"u_sampler");
    (*pcVar1)(uVar7,0);
  }
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x19f0))
            (uVar6,4,0x1406,0,0,drawTestPattern::fullscreenQuad);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x610))(uVar6);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x538))(5,0,4);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x518))(uVar6);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x648))();
  dVar5 = (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar5,"RenderCase::drawTestPattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,299);
  if (buffer.
      super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
    (**(code **)(patternProgram.m_program.m_info.linkTimeUs + 0x480))
              (1,(undefined1 *)
                 ((long)&buffer.
                         super__Vector_base<tcu::Vector<unsigned_char,_4>,_std::allocator<tcu::Vector<unsigned_char,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  pRVar12 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x_1,(Surface *)&errorMask.m_pixels.m_cap);
  glu::readPixels(pRVar12,0,0,(PixelBufferAccess *)&x_1);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2e8);
  texGradientPosX = 0.0;
  do {
    if (0xff < (int)texGradientPosX) {
      if ((local_81 & 1) == 0) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_a80,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_a80,(char (*) [23])"No side-effects found.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_a80);
      }
      else {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6b0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_6b0,(char (*) [40])"Test pattern has missing/invalid pixels");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6b0);
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_710,"Results",&local_711);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_738,"Result verification",&local_739);
        tcu::LogImageSet::LogImageSet(&local_6f0,&local_710,&local_738);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_6f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Result",&local_7f1)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_818,"Result",&local_819)
        ;
        tcu::LogImage::LogImage
                  (&local_7d0,&local_7f0,&local_818,(Surface *)&errorMask.m_pixels.m_cap,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_7d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8d0,"Error mask",&local_8d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f8,"Error mask",&local_8f9);
        tcu::LogImage::LogImage
                  (&local_8b0,&local_8d0,&local_8f8,(Surface *)local_80,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_8b0);
        tcu::TestLog::operator<<(pTVar9,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_8b0);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::allocator<char>::~allocator(&local_8f9);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator(&local_8d1);
        tcu::LogImage::~LogImage(&local_7d0);
        std::__cxx11::string::~string((string *)&local_818);
        std::allocator<char>::~allocator(&local_819);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::allocator<char>::~allocator(&local_7f1);
        tcu::LogImageSet::~LogImageSet(&local_6f0);
        std::__cxx11::string::~string((string *)&local_738);
        std::allocator<char>::~allocator(&local_739);
        std::__cxx11::string::~string((string *)&local_710);
        std::allocator<char>::~allocator(&local_711);
      }
      bVar3 = local_81 ^ 0xff;
      tcu::Surface::~Surface((Surface *)local_80);
      tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
      return (bool)(bVar3 & 1);
    }
    for (texGradientPosY = 0.0; (int)texGradientPosY < 0x100;
        texGradientPosY = (float)((int)texGradientPosY + 1)) {
      fVar16 = deFloatFrac(((float)(int)texGradientPosY + (float)(int)texGradientPosY) * 0.00390625)
      ;
      fVar17 = deFloatFrac(((float)(int)texGradientPosX + (float)(int)texGradientPosX) * 0.00390625)
      ;
      fVar16 = de::abs<float>(fVar16 + -0.5);
      fVar17 = de::abs<float>(fVar17 + -0.5);
      fVar16 = de::clamp<float>(fVar16 * 255.0 + fVar17 * 255.0,0.0,255.0);
      refColGradient.m_value._3_1_ = (undefined1)(int)fVar16;
      tcu::RGBA::RGBA(&local_4d0,(int)fVar16 & 0xff,0xff,0xff,0xff);
      tcu::RGBA::RGBA((RGBA *)((long)&refCol + 4),
                      (int)((float)(int)texGradientPosY * 0.00390625 * 255.0),0xff,0xff,0xff);
      colorDiff.m_data[3] = 10;
      colorDiff.m_data[2] =
           (int)tcu::Surface::getPixel
                          ((Surface *)&errorMask.m_pixels.m_cap,(int)texGradientPosY,
                           (int)texGradientPosX);
      tcu::RGBA::toIVec((RGBA *)&local_518);
      tcu::RGBA::toIVec((RGBA *)&local_528);
      tcu::operator-((tcu *)&local_508,&local_518,&local_528);
      tcu::abs<int,4>((tcu *)local_4f8,&local_508);
      iVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_4f8);
      iVar8 = tcu::RGBA::getRed((RGBA *)((long)&resultImage.m_pixels.m_cap + 4));
      if (iVar8 + 10 < iVar4) {
LAB_01b0f49d:
        local_52c = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel
                  ((Surface *)local_80,(int)texGradientPosY,(int)texGradientPosX,(RGBA)local_52c);
        local_81 = 1;
      }
      else {
        iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_4f8);
        iVar8 = tcu::RGBA::getGreen((RGBA *)((long)&resultImage.m_pixels.m_cap + 4));
        if (iVar8 + 10 < iVar4) goto LAB_01b0f49d;
        iVar4 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_4f8);
        iVar8 = tcu::RGBA::getBlue((RGBA *)((long)&resultImage.m_pixels.m_cap + 4));
        if (iVar8 + 10 < iVar4) goto LAB_01b0f49d;
        local_530 = (deUint32)tcu::RGBA::green();
        tcu::Surface::setPixel
                  ((Surface *)local_80,(int)texGradientPosY,(int)texGradientPosX,(RGBA)local_530);
      }
    }
    texGradientPosX = (float)((int)texGradientPosX + 1);
  } while( true );
}

Assistant:

bool RenderCase::drawTestPattern (bool useTexture)
{
	static const tcu::Vec4 fullscreenQuad[4] =
	{
		tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
		tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
	};
	const char* const	vertexSource		=	"attribute highp vec4 a_pos;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	v_position = a_pos;\n"
												"	gl_Position = a_pos;\n"
												"}\n";
	const char* const	fragmentSourceNoTex	=	"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = vec4((v_position.x + 1.0) * 0.5, 1.0, 1.0, 1.0);\n"
												"}\n";
	const char* const	fragmentSourceTex	=	"uniform mediump sampler2D u_sampler;\n"
												"varying mediump vec4 v_position;\n"
												"void main ()\n"
												"{\n"
												"	gl_FragColor = texture2D(u_sampler, v_position.xy);\n"
												"}\n";
	const char* const	fragmentSource		=	(useTexture) ? (fragmentSourceTex) : (fragmentSourceNoTex);
	const tcu::RGBA		formatThreshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	tcu::Surface		resultImage			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface		errorMask			(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	bool				error				=	false;

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a test pattern to detect " << ((useTexture) ? ("texture sampling") : ("")) << " side-effects." << tcu::TestLog::EndMessage;

	// draw pattern
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	patternProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));
		const GLint					positionLoc		= gl.getAttribLocation(patternProgram.getProgram(), "a_pos");
		GLuint						textureID		= 0;

		if (useTexture)
		{
			const int textureSize = 32;
			std::vector<tcu::Vector<deUint8, 4> > buffer(textureSize*textureSize);

			for (int x = 0; x < textureSize; ++x)
			for (int y = 0; y < textureSize; ++y)
			{
				// sum of two axis aligned gradients. Each gradient is 127 at the edges and 0 at the center.
				// pattern is symmetric (x and y) => no discontinuity near boundary => no need to worry of results with LINEAR filtering near boundaries
				const deUint8 redComponent = (deUint8)de::clamp(de::abs((float)x / (float)textureSize - 0.5f) * 255.0f + de::abs((float)y / (float)textureSize - 0.5f) * 255.0f, 0.0f, 255.0f);

				buffer[x * textureSize + y] = tcu::Vector<deUint8, 4>(redComponent, 255, 255, 255);
			}

			gl.genTextures(1, &textureID);
			gl.bindTexture(GL_TEXTURE_2D, textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, textureSize, textureSize, 0, GL_RGBA, GL_UNSIGNED_BYTE, buffer[0].getPtr());
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(patternProgram.getProgram());

		if (useTexture)
			gl.uniform1i(gl.getUniformLocation(patternProgram.getProgram(), "u_sampler"), 0);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &fullscreenQuad[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "RenderCase::drawTestPattern");

		if (textureID)
			gl.deleteTextures(1, &textureID);

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify pattern
	for (int y = 0; y < TEST_CANVAS_SIZE; ++y)
	for (int x = 0; x < TEST_CANVAS_SIZE; ++x)
	{
		const float			texGradientPosX = deFloatFrac((float)x * 2.0f / (float)TEST_CANVAS_SIZE);
		const float			texGradientPosY = deFloatFrac((float)y * 2.0f / (float)TEST_CANVAS_SIZE);
		const deUint8		texRedComponent = (deUint8)de::clamp(de::abs(texGradientPosX - 0.5f) * 255.0f + de::abs(texGradientPosY - 0.5f) * 255.0f, 0.0f, 255.0f);

		const tcu::RGBA		refColTexture	= tcu::RGBA(texRedComponent, 255, 255, 255);
		const tcu::RGBA		refColGradient	= tcu::RGBA((int)((float)x / (float)TEST_CANVAS_SIZE * 255.0f), 255, 255, 255);
		const tcu::RGBA&	refCol			= (useTexture) ? (refColTexture) : (refColGradient);

		const int			colorThreshold	= 10;
		const tcu::RGBA		col				= resultImage.getPixel(x, y);
		const tcu::IVec4	colorDiff		= tcu::abs(col.toIVec() - refCol.toIVec());

		if (colorDiff.x() > formatThreshold.getRed()   + colorThreshold ||
			colorDiff.y() > formatThreshold.getGreen() + colorThreshold ||
			colorDiff.z() > formatThreshold.getBlue()  + colorThreshold)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			error = true;
		}
		else
			errorMask.setPixel(x, y, tcu::RGBA::green());
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test pattern has missing/invalid pixels" << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		resultImage)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "No side-effects found." << tcu::TestLog::EndMessage;

	return !error;
}